

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O2

void Bmcg_ManPrintTime(Bmcg_Man_t *p)

{
  int level;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  level = (int)p;
  if (p->pPars->fVerbose != 0) {
    lVar1 = p->timeSat + p->timeCnf + p->timeSmp + p->timeUnf + p->timeOth;
    Abc_Print(level,"%s =","Unfolding     ");
    dVar3 = (double)lVar1;
    dVar4 = 0.0;
    if (lVar1 != 0) {
      dVar4 = ((double)p->timeUnf * 100.0) / dVar3;
    }
    dVar6 = 0.0;
    if (lVar1 != 0) {
      dVar6 = (dVar3 * 100.0) / dVar3;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeUnf / 1000000.0,dVar4);
    Abc_Print(level,"%s =","CNF generation");
    dVar5 = (double)p->timeCnf;
    dVar2 = dVar5 / 1000000.0;
    dVar4 = 0.0;
    if (lVar1 != 0) {
      dVar5 = (dVar5 * 100.0) / dVar3;
      dVar4 = dVar5;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar2,dVar4,dVar5);
    Abc_Print(level,"%s =","CNF simplify  ");
    dVar5 = (double)p->timeSmp;
    dVar2 = dVar5 / 1000000.0;
    dVar4 = 0.0;
    if (lVar1 != 0) {
      dVar5 = (dVar5 * 100.0) / dVar3;
      dVar4 = dVar5;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar2,dVar4,dVar5);
    Abc_Print(level,"%s =","SAT solving   ");
    dVar5 = (double)p->timeSat;
    dVar2 = dVar5 / 1000000.0;
    dVar4 = 0.0;
    if (lVar1 != 0) {
      dVar5 = (dVar5 * 100.0) / dVar3;
      dVar4 = dVar5;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar2,dVar4,dVar5);
    Abc_Print(level,"%s =","Other         ");
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeOth / 1000000.0);
    Abc_Print(level,"%s =","TOTAL         ");
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar3 / 1000000.0,dVar6);
    return;
  }
  return;
}

Assistant:

void Bmcg_ManPrintTime( Bmcg_Man_t * p )
{
    abctime clkTotal = p->timeUnf + p->timeCnf + p->timeSmp + p->timeSat + p->timeOth;
    if ( !p->pPars->fVerbose )
        return;
    ABC_PRTP( "Unfolding     ", p->timeUnf,  clkTotal );
    ABC_PRTP( "CNF generation", p->timeCnf,  clkTotal );
    ABC_PRTP( "CNF simplify  ", p->timeSmp,  clkTotal );
    ABC_PRTP( "SAT solving   ", p->timeSat,  clkTotal );
    ABC_PRTP( "Other         ", p->timeOth,  clkTotal );
    ABC_PRTP( "TOTAL         ", clkTotal  ,  clkTotal );
}